

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommand.cxx
# Opt level: O2

void __thiscall cmCustomCommand::SetComment(cmCustomCommand *this,char *comment)

{
  std::__cxx11::string::assign((char *)&this->Comment);
  this->HaveComment = comment != (char *)0x0;
  return;
}

Assistant:

void cmCustomCommand::SetComment(const char* comment)
{
  this->Comment = comment ? comment : "";
  this->HaveComment = (comment != nullptr);
}